

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

double geopolySine(double r)

{
  double in_XMM0_Qa;
  double dVar1;
  double r5;
  double r3;
  double r2;
  double in_stack_ffffffffffffffe8;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_XMM0_Qa;
  if (4.71238898038469 <= in_XMM0_Qa) {
    local_10 = in_XMM0_Qa - 6.283185307179586;
  }
  if (local_10 < 1.5707963267948966) {
    dVar1 = local_10 * local_10 * local_10;
    local_8 = dVar1 * local_10 * local_10 * 0.0075134 + local_10 * 0.9996949 + -(dVar1 * 0.16567);
  }
  else {
    local_8 = geopolySine(in_stack_ffffffffffffffe8);
    local_8 = -local_8;
  }
  return local_8;
}

Assistant:

static double geopolySine(double r){
  assert( r>=-0.5*GEOPOLY_PI && r<=2.0*GEOPOLY_PI );
  if( r>=1.5*GEOPOLY_PI ){
    r -= 2.0*GEOPOLY_PI;
  }
  if( r>=0.5*GEOPOLY_PI ){
    return -geopolySine(r-GEOPOLY_PI);
  }else{
    double r2 = r*r;
    double r3 = r2*r;
    double r5 = r3*r2;
    return 0.9996949*r - 0.1656700*r3 + 0.0075134*r5;
  }
}